

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O0

Index __thiscall
IndividualBeliefJESP::GetAugmentedStateIndex
          (IndividualBeliefJESP *this,Index sI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oHist_others)

{
  Index IVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  LIndex i;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  long in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  Index j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> withinStageOHIndices_o;
  Index in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff4c;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  value_type in_stack_ffffffffffffff64;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  uint local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9c6b4f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9c6b75);
  local_48 = 0;
  while( true ) {
    uVar2 = (ulong)local_48;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_30);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_18,(ulong)local_48);
    in_stack_ffffffffffffff64 = *pvVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x48),
               (ulong)local_48);
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff60 = Globals::CastLIndexToIndex(i);
    in_stack_ffffffffffffff5c = in_stack_ffffffffffffff64 - in_stack_ffffffffffffff60;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_30,(ulong)local_48);
    *pvVar5 = in_stack_ffffffffffffff5c;
    local_48 = local_48 + 1;
  }
  this_00 = &local_60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9c6c81);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  IVar1 = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_00,(value_type_conflict1 *)CONCAT44(IVar1,in_stack_ffffffffffffff48));
  IVar1 = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return IVar1;
}

Assistant:

Index 
IndividualBeliefJESP::GetAugmentedStateIndex(Index sI, 
        const vector<Index>& oHist_others) const
{
    //get indices without the offset for the stage:
    vector<Index> withinStageOHIndices_o = vector<Index>(oHist_others.size());
    for(Index j=0; j < withinStageOHIndices_o.size(); j++)
        withinStageOHIndices_o[j] = oHist_others[j] -
            CastLIndexToIndex(_m_pumadp->GetFirstObservationHistoryIndex( _m_others[j], _m_stage)); 

    vector<Index> v;
    v.push_back(sI);
    v.push_back(
        IndexTools::IndividualToJointIndicesStepSize(withinStageOHIndices_o, 
            _m_stepsizeJOHOH ) );
    return( IndexTools::IndividualToJointIndicesStepSize( v, 
            _m_stepsizeSJOH) );
}